

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.c
# Opt level: O0

int X509_CRL_digest(X509_CRL *data,EVP_MD *type,uchar *md,uint *len)

{
  uchar *unaff_retaddr;
  void *in_stack_00000008;
  EVP_MD *in_stack_00000010;
  ASN1_ITEM *in_stack_00000018;
  char *in_stack_00000030;
  EVP_MD *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (type == (EVP_MD *)0x0) {
    ERR_new();
    ERR_set_debug((char *)md,(int)((ulong)len >> 0x20),in_stack_ffffffffffffffd0);
    ERR_set_error(0xb,0xc0102,(char *)0x0);
    iVar1 = 0;
  }
  else {
    iVar1 = EVP_MD_is_a(in_stack_ffffffffffffffc8,(char *)0x2dbb50);
    if (((iVar1 == 0) ||
        (((ulong)(((OSSL_LIB_CTX *)data)->global).ex_data[0xc].meth & 0x10000000000) == 0)) ||
       (((ulong)(((OSSL_LIB_CTX *)data)->global).ex_data[0xc].meth & 0x10000000000000) != 0)) {
      X509_CRL_it();
      iVar1 = ossl_asn1_item_digest_ex
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                         (uint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (OSSL_LIB_CTX *)data,in_stack_00000030);
    }
    else {
      if (len != (uint *)0x0) {
        *len = 0x14;
      }
      *(undefined8 *)md = *(undefined8 *)(((OSSL_LIB_CTX *)data)->dyn_indexes + 2);
      *(undefined8 *)(md + 8) = *(undefined8 *)(((OSSL_LIB_CTX *)data)->dyn_indexes + 4);
      *(int *)(md + 0x10) = ((OSSL_LIB_CTX *)data)->dyn_indexes[6];
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int X509_CRL_digest(const X509_CRL *data, const EVP_MD *type,
                    unsigned char *md, unsigned int *len)
{
    if (type == NULL) {
        ERR_raise(ERR_LIB_X509, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }
    if (EVP_MD_is_a(type, SN_sha1)
            && (data->flags & EXFLAG_SET) != 0
            && (data->flags & EXFLAG_NO_FINGERPRINT) == 0) {
        /* Asking for SHA1; always computed in CRL d2i. */
        if (len != NULL)
            *len = sizeof(data->sha1_hash);
        memcpy(md, data->sha1_hash, sizeof(data->sha1_hash));
        return 1;
    }
    return ossl_asn1_item_digest_ex(ASN1_ITEM_rptr(X509_CRL), type, (char *)data,
                                    md, len, data->libctx, data->propq);
}